

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderCancelRequest.h
# Opt level: O2

void __thiscall
FIX40::OrderCancelRequest::OrderCancelRequest
          (OrderCancelRequest *this,OrigClOrdID *aOrigClOrdID,ClOrdID *aClOrdID,CxlType *aCxlType,
          Symbol *aSymbol,Side *aSide,OrderQty *aOrderQty)

{
  FieldBase local_88;
  
  MsgType();
  Message::Message(&this->super_Message,(MsgType *)&local_88);
  FIX::FieldBase::~FieldBase(&local_88);
  *(undefined ***)&this->super_Message = &PTR__Message_00158b70;
  set(this,aOrigClOrdID);
  set(this,aClOrdID);
  set(this,aCxlType);
  set(this,aSymbol);
  set(this,aSide);
  set(this,aOrderQty);
  return;
}

Assistant:

OrderCancelRequest(
      const FIX::OrigClOrdID& aOrigClOrdID,
      const FIX::ClOrdID& aClOrdID,
      const FIX::CxlType& aCxlType,
      const FIX::Symbol& aSymbol,
      const FIX::Side& aSide,
      const FIX::OrderQty& aOrderQty )
    : Message(MsgType())
    {
      set(aOrigClOrdID);
      set(aClOrdID);
      set(aCxlType);
      set(aSymbol);
      set(aSide);
      set(aOrderQty);
    }